

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O2

RPCHelpMan * decodepsbt(void)

{
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  string m_key_name_15;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_18;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  undefined1 auVar1 [32];
  long lVar2;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  undefined4 in_stack_ffffffffffffeb38;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffeb3c;
  undefined8 in_stack_ffffffffffffeb40;
  undefined8 in_stack_ffffffffffffeb48;
  undefined8 in_stack_ffffffffffffeb50;
  _Manager_type in_stack_ffffffffffffeb58;
  undefined8 in_stack_ffffffffffffeb60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffeb68;
  pointer in_stack_ffffffffffffeb78;
  pointer pRVar4;
  pointer in_stack_ffffffffffffeb80;
  pointer pRVar5;
  pointer in_stack_ffffffffffffeb88;
  pointer pRVar6;
  undefined8 in_stack_ffffffffffffeb90;
  pointer in_stack_ffffffffffffeb98;
  pointer pRVar7;
  pointer in_stack_ffffffffffffeba0;
  pointer pRVar8;
  pointer in_stack_ffffffffffffeba8;
  pointer pRVar9;
  undefined8 in_stack_ffffffffffffebb0;
  pointer in_stack_ffffffffffffebb8;
  pointer in_stack_ffffffffffffebc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffebc8;
  pointer in_stack_ffffffffffffebd8;
  pointer pRVar10;
  pointer in_stack_ffffffffffffebe0;
  pointer pRVar11;
  pointer in_stack_ffffffffffffebe8;
  undefined8 in_stack_ffffffffffffebf0;
  pointer in_stack_ffffffffffffebf8;
  pointer in_stack_ffffffffffffec00;
  pointer in_stack_ffffffffffffec08;
  undefined8 in_stack_ffffffffffffec10;
  pointer in_stack_ffffffffffffec18;
  allocator<char> local_13ca;
  allocator<char> local_13c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13c8;
  allocator<char> local_13aa;
  allocator<char> local_13a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13a8;
  allocator<char> local_138a;
  allocator<char> local_1389;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1388;
  allocator<char> local_136a;
  allocator<char> local_1369;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1368;
  allocator<char> local_134c;
  allocator<char> local_134b;
  allocator_type local_134a;
  allocator_type local_1349;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1348;
  allocator<char> local_132a;
  allocator<char> local_1329;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1328;
  allocator<char> local_130a;
  allocator<char> local_1309;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1308;
  allocator<char> local_12ea;
  allocator<char> local_12e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12e8;
  allocator<char> local_12ca;
  allocator<char> local_12c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12c8;
  allocator<char> local_12ab;
  allocator<char> local_12aa;
  allocator_type local_12a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_12a8;
  allocator<char> local_128a;
  allocator<char> local_1289;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1288;
  allocator<char> local_126a;
  allocator<char> local_1269;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1268;
  allocator<char> local_124a;
  allocator<char> local_1249;
  RPCResults local_1248;
  allocator_type local_122b;
  allocator<char> local_122a;
  allocator<char> local_1229;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1228;
  allocator<char> local_120a;
  allocator<char> local_1209;
  string local_1208;
  string local_11e8;
  string local_11c8;
  char *local_11a8;
  size_type local_11a0;
  char local_1198 [8];
  undefined8 uStack_1190;
  string local_1188 [32];
  string local_1168 [32];
  string local_1148 [32];
  string local_1128 [32];
  RPCResult local_1108;
  string local_1080 [32];
  string local_1060 [32];
  string local_1040 [16];
  undefined8 local_1030;
  string local_1020 [32];
  string local_1000 [32];
  string local_fe0 [32];
  string local_fc0 [32];
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  RPCResult local_f40 [4];
  string local_d20 [32];
  string local_d00 [32];
  RPCResult local_ce0;
  string local_c58 [32];
  string local_c38 [32];
  string local_c18 [32];
  string local_bf8 [32];
  string local_bd8 [32];
  string local_bb8 [32];
  string local_b98 [32];
  string local_b78 [32];
  string local_b58 [32];
  string local_b38 [32];
  RPCResult local_b18 [3];
  string local_980 [32];
  string local_960 [32];
  RPCResult local_940;
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  RPCResult local_838;
  string local_7b0 [32];
  string local_790 [32];
  RPCResult local_770 [4];
  RPCResult local_550;
  RPCResult local_4c8;
  RPCResult local_440;
  RPCResult local_3b8;
  string local_330 [32];
  string local_310 [32];
  RPCResult local_2f0;
  RPCArgOptions local_268;
  string local_220 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  string local_1a0 [32];
  RPCArg local_180;
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"decodepsbt",&local_1209);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "Return a JSON object representing the serialized, base64-encoded partially signed Bitcoin transaction."
             ,&local_120a);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"psbt",&local_1229);
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a8 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_220,"The PSBT base64 string",&local_122a)
  ;
  local_268.oneline_description._M_dataplus._M_p = (pointer)&local_268.oneline_description.field_2;
  local_268.skip_type_check = false;
  local_268.oneline_description._M_string_length = 0;
  local_268.oneline_description.field_2._M_local_buf[0] = '\0';
  local_268.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_268.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_268.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_268._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  name._M_string_length = in_stack_ffffffffffffeb40;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  name.field_2._8_8_ = in_stack_ffffffffffffeb50;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffeb60;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffeb58;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffeb68;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffeb78;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffeb80;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffeb88;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffeb90;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffeb98;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffeba0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffeba8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffebb0;
  description_18._M_string_length = (size_type)in_stack_ffffffffffffebc0;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebb8;
  description_18.field_2 = in_stack_ffffffffffffebc8;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffebe0;
  opts._0_8_ = in_stack_ffffffffffffebd8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffebe8;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffebf0;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffebf8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffec00;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffec08;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffec10;
  opts._64_8_ = in_stack_ffffffffffffec18;
  RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_18,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1228,__l,&local_122b);
  std::__cxx11::string::string<std::allocator<char>>(local_310,"",&local_1249);
  std::__cxx11::string::string<std::allocator<char>>(local_330,"",&local_124a);
  std::__cxx11::string::string<std::allocator<char>>(local_790,"tx",&local_1269);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7b0,"The decoded network-serialized unsigned transaction.",&local_126a);
  std::__cxx11::string::string<std::allocator<char>>(local_858,"",&local_1289);
  std::__cxx11::string::string<std::allocator<char>>
            (local_878,"The layout is the same as the output of decoderawtransaction.",&local_128a);
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description._M_string_length = in_stack_ffffffffffffeb60;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description.field_2 = in_stack_ffffffffffffeb68;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffeb80;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffeb78;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult(&local_838,ELISION,m_key_name,description,inner,SUB81(local_858,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_838;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1288,__l_00,&local_12a9);
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_00._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_00._M_string_length = in_stack_ffffffffffffeb60;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_00.field_2 = in_stack_ffffffffffffeb68;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult(local_770,OBJ,m_key_name_00,description_00,inner_00,SUB81(local_790,0));
  std::__cxx11::string::string<std::allocator<char>>(local_898,"global_xpubs",&local_12aa);
  std::__cxx11::string::string<std::allocator<char>>(local_8b8,"",&local_12ab);
  std::__cxx11::string::string<std::allocator<char>>(local_960,"",&local_12c9);
  std::__cxx11::string::string<std::allocator<char>>(local_980,"",&local_12ca);
  std::__cxx11::string::string<std::allocator<char>>(local_b38,"xpub",&local_12e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b58,"The extended public key this path corresponds to",&local_12ea);
  local_1308.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1308.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1308.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_01._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_01._M_string_length = in_stack_ffffffffffffeb60;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_01.field_2 = in_stack_ffffffffffffeb68;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult(local_b18,STR,m_key_name_01,description_01,inner_01,SUB81(local_b38,0));
  std::__cxx11::string::string<std::allocator<char>>(local_b78,"master_fingerprint",&local_1309);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b98,"The fingerprint of the master key",&local_130a);
  local_1328.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1328.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1328.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_02._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_02._M_string_length = in_stack_ffffffffffffeb60;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_02.field_2 = in_stack_ffffffffffffeb68;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult
            (local_b18 + 1,STR_HEX,m_key_name_02,description_02,inner_02,SUB81(local_b78,0));
  std::__cxx11::string::string<std::allocator<char>>(local_bb8,"path",&local_1329);
  std::__cxx11::string::string<std::allocator<char>>(local_bd8,"The path",&local_132a);
  local_1348.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1348.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1348.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_03._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_03._M_string_length = in_stack_ffffffffffffeb60;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_03.field_2._M_local_buf = in_stack_ffffffffffffeb68._M_local_buf;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult(local_b18 + 2,STR,m_key_name_03,description_03,inner_03,SUB81(local_bb8,0));
  __l_01._M_len = 3;
  __l_01._M_array = local_b18;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_12e8,__l_01,&local_1349);
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_04._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_04._M_string_length = in_stack_ffffffffffffeb60;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_04.field_2 = in_stack_ffffffffffffeb68;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult(&local_940,OBJ,m_key_name_04,description_04,inner_04,SUB81(local_960,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_940;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_12c8,__l_02,&local_134a);
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_05._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_05._M_string_length = in_stack_ffffffffffffeb60;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_05.field_2 = in_stack_ffffffffffffeb68;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult(local_770 + 1,ARR,m_key_name_05,description_05,inner_05,SUB81(local_898,0));
  std::__cxx11::string::string<std::allocator<char>>(local_bf8,"psbt_version",&local_134b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c18,
             "The PSBT version number. Not to be confused with the unsigned transaction version",
             &local_134c);
  local_1368.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1368.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1368.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_06._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_06._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_06._M_string_length = in_stack_ffffffffffffeb60;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_06.field_2 = in_stack_ffffffffffffeb68;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult(local_770 + 2,NUM,m_key_name_06,description_06,inner_06,SUB81(local_bf8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_c38,"proprietary",&local_1369);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c58,"The global proprietary map",&local_136a);
  std::__cxx11::string::string<std::allocator<char>>(local_d00,"",&local_1389);
  std::__cxx11::string::string<std::allocator<char>>(local_d20,"",&local_138a);
  std::__cxx11::string::string<std::allocator<char>>(local_f60,"identifier",&local_13a9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f80,"The hex string for the proprietary identifier",&local_13aa);
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_07._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_07._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_07._M_string_length = in_stack_ffffffffffffeb60;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_07.field_2 = in_stack_ffffffffffffeb68;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult(local_f40,STR_HEX,m_key_name_07,description_07,inner_07,SUB81(local_f60,0));
  std::__cxx11::string::string<std::allocator<char>>(local_fa0,"subtype",&local_13c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_fc0,"The number for the subtype",&local_13ca);
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_08._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_08._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_08._M_string_length = in_stack_ffffffffffffeb60;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_08.field_2 = in_stack_ffffffffffffeb68;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult(local_f40 + 1,NUM,m_key_name_08,description_08,inner_08,SUB81(local_fa0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_fe0,"key",(allocator<char> *)&stack0xffffffffffffec17);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1000,"The hex for the key",(allocator<char> *)&stack0xffffffffffffec16);
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_09._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_09._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_09._M_string_length = in_stack_ffffffffffffeb60;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_09.field_2 = in_stack_ffffffffffffeb68;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult
            (local_f40 + 2,STR_HEX,m_key_name_09,description_09,inner_09,SUB81(local_fe0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1020,"value",(allocator<char> *)&stack0xffffffffffffebf7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1040,"The hex for the value",(allocator<char> *)&stack0xffffffffffffebf6);
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_10._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_10._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_10.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_10.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_10._M_string_length = in_stack_ffffffffffffeb60;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_10.field_2._M_local_buf = in_stack_ffffffffffffeb68._M_local_buf;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult
            (local_f40 + 3,STR_HEX,m_key_name_10,description_10,inner_10,SUB81(local_1020,0));
  __l_03._M_len = 4;
  __l_03._M_array = local_f40;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_13a8,__l_03,(allocator_type *)&stack0xffffffffffffebd7);
  m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_11._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_11._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_11.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_11.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_11._M_string_length = in_stack_ffffffffffffeb60;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_11.field_2 = in_stack_ffffffffffffeb68;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult(&local_ce0,OBJ,m_key_name_11,description_11,inner_11,false);
  __l_04._M_len = 1;
  __l_04._M_array = &local_ce0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1388,__l_04,(allocator_type *)&stack0xffffffffffffebd6);
  m_key_name_12._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_12._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_12._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_12.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_12.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_12._M_string_length = in_stack_ffffffffffffeb60;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_12.field_2 = in_stack_ffffffffffffeb68;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult(local_770 + 3,ARR,m_key_name_12,description_12,inner_12,SUB81(local_c38,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1060,"unknown",(allocator<char> *)&stack0xffffffffffffebd5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1080,"The unknown global fields",(allocator<char> *)&stack0xffffffffffffebd4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1128,"key",(allocator<char> *)&stack0xffffffffffffebb7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1148,"(key-value pair) An unknown key-value pair",
             (allocator<char> *)&stack0xffffffffffffebb6);
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  m_key_name_13._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_13._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_13._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_13.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_13.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_13._M_string_length = in_stack_ffffffffffffeb60;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_13.field_2 = in_stack_ffffffffffffeb68;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult
            (&local_1108,STR_HEX,m_key_name_13,description_13,inner_13,SUB81(local_1128,0));
  __l_05._M_len = 1;
  __l_05._M_array = &local_1108;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffebb8,__l_05,
             (allocator_type *)&stack0xffffffffffffeb97);
  m_key_name_14._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_14._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb38;
  m_key_name_14._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_14.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_14.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_14._M_string_length = in_stack_ffffffffffffeb60;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_14.field_2 = in_stack_ffffffffffffeb68;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb80;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb78;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb88;
  RPCResult::RPCResult(&local_550,OBJ_DYN,m_key_name_14,description_14,inner_14,SUB81(local_1060,0))
  ;
  RPCResult::RPCResult(&local_4c8,&decodepsbt_inputs);
  RPCResult::RPCResult(&local_440,&decodepsbt_outputs);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1168,"fee",(allocator<char> *)&stack0xffffffffffffeb96);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1188,"The transaction fee paid if all UTXOs slots in the PSBT have been filled.",
             (allocator<char> *)&stack0xffffffffffffeb95);
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  uVar3 = 0;
  auVar1._4_8_ = in_stack_ffffffffffffeb40;
  auVar1._0_4_ = in_stack_ffffffffffffeb3c;
  auVar1._12_8_ = in_stack_ffffffffffffeb48;
  auVar1._20_8_ = in_stack_ffffffffffffeb50;
  auVar1._28_4_ = 0;
  description_15._M_string_length = in_stack_ffffffffffffeb60;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_15.field_2 = in_stack_ffffffffffffeb68;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (&local_3b8,STR_AMOUNT,(string)(auVar1 << 0x20),SUB81(local_1168,0),description_15,
             inner_15,true);
  __l_06._M_len = 8;
  __l_06._M_array = local_770;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1268,__l_06,(allocator_type *)&stack0xffffffffffffeb77);
  m_key_name_15._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb3c;
  m_key_name_15._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_15._M_string_length = in_stack_ffffffffffffeb40;
  m_key_name_15.field_2._M_allocated_capacity = in_stack_ffffffffffffeb48;
  m_key_name_15.field_2._8_8_ = in_stack_ffffffffffffeb50;
  description_16._M_string_length = in_stack_ffffffffffffeb60;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb58;
  description_16.field_2 = in_stack_ffffffffffffeb68;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar5;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar4;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar6;
  RPCResult::RPCResult(&local_2f0,OBJ,m_key_name_15,description_16,inner_16,SUB81(local_310,0));
  result._4_4_ = in_stack_ffffffffffffeb3c;
  result.m_type = uVar3;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb40;
  result.m_key_name._M_string_length = in_stack_ffffffffffffeb48;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffeb50;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffeb58;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeb60;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffeb68;
  result._64_8_ = pRVar4;
  result.m_description._M_dataplus._M_p = (pointer)pRVar5;
  result.m_description._M_string_length = (size_type)pRVar6;
  result.m_description.field_2._M_allocated_capacity = in_stack_ffffffffffffeb90;
  result.m_description.field_2._8_8_ = pRVar7;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar8;
  result.m_cond._M_string_length = (size_type)pRVar9;
  result.m_cond.field_2._M_allocated_capacity = in_stack_ffffffffffffebb0;
  result.m_cond.field_2._8_8_ = in_stack_ffffffffffffebb8;
  RPCResults::RPCResults(&local_1248,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11e8,"decodepsbt",(allocator<char> *)&stack0xffffffffffffeb76);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1208,"\"psbt\"",(allocator<char> *)&stack0xffffffffffffeb75);
  HelpExampleCli(&local_11c8,&local_11e8,&local_1208);
  local_11a8 = local_1198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11c8._M_dataplus._M_p == &local_11c8.field_2) {
    uStack_1190 = local_11c8.field_2._8_8_;
  }
  else {
    local_11a8 = local_11c8._M_dataplus._M_p;
  }
  local_11a0 = local_11c8._M_string_length;
  local_11c8._M_string_length = 0;
  local_11c8.field_2._M_local_buf[0] = '\0';
  description_17._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:1070:9)>
       ::_M_invoke;
  description_17._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:1070:9)>
                ::_M_manager;
  description_17.field_2 = in_stack_ffffffffffffeb68;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar5;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar4;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar6;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar7;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeb90;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar8;
  examples.m_examples._M_string_length = in_stack_ffffffffffffebb0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar9;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffebb8;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffebc0;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar10;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_ffffffffffffebc8._M_local_buf;
  fun._M_invoker = (_Invoker_type)pRVar11;
  local_11c8._M_dataplus._M_p = (pointer)&local_11c8.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffeb40,&stack0xffffffffffffeb48)),
             description_17,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffeb48);
  std::__cxx11::string::~string((string *)&local_11a8);
  std::__cxx11::string::~string((string *)&local_11c8);
  std::__cxx11::string::~string((string *)&local_1208);
  std::__cxx11::string::~string((string *)&local_11e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1248.m_results);
  RPCResult::~RPCResult(&local_2f0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1268);
  lVar2 = 0x3b8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_770[0].m_type + lVar2));
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb78);
  std::__cxx11::string::~string(local_1188);
  std::__cxx11::string::~string(local_1168);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffebb8);
  RPCResult::~RPCResult(&local_1108);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb98);
  std::__cxx11::string::~string(local_1148);
  std::__cxx11::string::~string(local_1128);
  std::__cxx11::string::~string(local_1080);
  std::__cxx11::string::~string(local_1060);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1388);
  RPCResult::~RPCResult(&local_ce0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13a8);
  lVar2 = 0x198;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_f40[0].m_type + lVar2));
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffebd8);
  std::__cxx11::string::~string(local_1040);
  std::__cxx11::string::~string(local_1020);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffebf8);
  std::__cxx11::string::~string(local_1000);
  std::__cxx11::string::~string(local_fe0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffec18);
  std::__cxx11::string::~string(local_fc0);
  std::__cxx11::string::~string(local_fa0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13c8);
  std::__cxx11::string::~string(local_f80);
  std::__cxx11::string::~string(local_f60);
  std::__cxx11::string::~string(local_d20);
  std::__cxx11::string::~string(local_d00);
  std::__cxx11::string::~string(local_c58);
  std::__cxx11::string::~string(local_c38);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1368);
  std::__cxx11::string::~string(local_c18);
  std::__cxx11::string::~string(local_bf8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12c8);
  RPCResult::~RPCResult(&local_940);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12e8);
  lVar2 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_b18[0].m_type + lVar2));
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1348);
  std::__cxx11::string::~string(local_bd8);
  std::__cxx11::string::~string(local_bb8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1328);
  std::__cxx11::string::~string(local_b98);
  std::__cxx11::string::~string(local_b78);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1308);
  std::__cxx11::string::~string(local_b58);
  std::__cxx11::string::~string(local_b38);
  std::__cxx11::string::~string(local_980);
  std::__cxx11::string::~string(local_960);
  std::__cxx11::string::~string(local_8b8);
  std::__cxx11::string::~string(local_898);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1288);
  RPCResult::~RPCResult(&local_838);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_12a8);
  std::__cxx11::string::~string(local_878);
  std::__cxx11::string::~string(local_858);
  std::__cxx11::string::~string(local_7b0);
  std::__cxx11::string::~string(local_790);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string(local_310);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1228);
  RPCArg::~RPCArg(&local_180);
  RPCArgOptions::~RPCArgOptions(&local_268);
  std::__cxx11::string::~string(local_220);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan decodepsbt()
{
    return RPCHelpMan{
        "decodepsbt",
        "Return a JSON object representing the serialized, base64-encoded partially signed Bitcoin transaction.",
                {
                    {"psbt", RPCArg::Type::STR, RPCArg::Optional::NO, "The PSBT base64 string"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::OBJ, "tx", "The decoded network-serialized unsigned transaction.",
                        {
                            {RPCResult::Type::ELISION, "", "The layout is the same as the output of decoderawtransaction."},
                        }},
                        {RPCResult::Type::ARR, "global_xpubs", "",
                        {
                            {RPCResult::Type::OBJ, "", "",
                            {
                                {RPCResult::Type::STR, "xpub", "The extended public key this path corresponds to"},
                                {RPCResult::Type::STR_HEX, "master_fingerprint", "The fingerprint of the master key"},
                                {RPCResult::Type::STR, "path", "The path"},
                            }},
                        }},
                        {RPCResult::Type::NUM, "psbt_version", "The PSBT version number. Not to be confused with the unsigned transaction version"},
                        {RPCResult::Type::ARR, "proprietary", "The global proprietary map",
                        {
                            {RPCResult::Type::OBJ, "", "",
                            {
                                {RPCResult::Type::STR_HEX, "identifier", "The hex string for the proprietary identifier"},
                                {RPCResult::Type::NUM, "subtype", "The number for the subtype"},
                                {RPCResult::Type::STR_HEX, "key", "The hex for the key"},
                                {RPCResult::Type::STR_HEX, "value", "The hex for the value"},
                            }},
                        }},
                        {RPCResult::Type::OBJ_DYN, "unknown", "The unknown global fields",
                        {
                             {RPCResult::Type::STR_HEX, "key", "(key-value pair) An unknown key-value pair"},
                        }},
                        decodepsbt_inputs,
                        decodepsbt_outputs,
                        {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The transaction fee paid if all UTXOs slots in the PSBT have been filled."},
                    }
                },
                RPCExamples{
                    HelpExampleCli("decodepsbt", "\"psbt\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    // Unserialize the transactions
    PartiallySignedTransaction psbtx;
    std::string error;
    if (!DecodeBase64PSBT(psbtx, request.params[0].get_str(), error)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed %s", error));
    }

    UniValue result(UniValue::VOBJ);

    // Add the decoded tx
    UniValue tx_univ(UniValue::VOBJ);
    TxToUniv(CTransaction(*psbtx.tx), /*block_hash=*/uint256(), /*entry=*/tx_univ, /*include_hex=*/false);
    result.pushKV("tx", std::move(tx_univ));

    // Add the global xpubs
    UniValue global_xpubs(UniValue::VARR);
    for (std::pair<KeyOriginInfo, std::set<CExtPubKey>> xpub_pair : psbtx.m_xpubs) {
        for (auto& xpub : xpub_pair.second) {
            std::vector<unsigned char> ser_xpub;
            ser_xpub.assign(BIP32_EXTKEY_WITH_VERSION_SIZE, 0);
            xpub.EncodeWithVersion(ser_xpub.data());

            UniValue keypath(UniValue::VOBJ);
            keypath.pushKV("xpub", EncodeBase58Check(ser_xpub));
            keypath.pushKV("master_fingerprint", HexStr(Span<unsigned char>(xpub_pair.first.fingerprint, xpub_pair.first.fingerprint + 4)));
            keypath.pushKV("path", WriteHDKeypath(xpub_pair.first.path));
            global_xpubs.push_back(std::move(keypath));
        }
    }
    result.pushKV("global_xpubs", std::move(global_xpubs));

    // PSBT version
    result.pushKV("psbt_version", static_cast<uint64_t>(psbtx.GetVersion()));

    // Proprietary
    UniValue proprietary(UniValue::VARR);
    for (const auto& entry : psbtx.m_proprietary) {
        UniValue this_prop(UniValue::VOBJ);
        this_prop.pushKV("identifier", HexStr(entry.identifier));
        this_prop.pushKV("subtype", entry.subtype);
        this_prop.pushKV("key", HexStr(entry.key));
        this_prop.pushKV("value", HexStr(entry.value));
        proprietary.push_back(std::move(this_prop));
    }
    result.pushKV("proprietary", std::move(proprietary));

    // Unknown data
    UniValue unknowns(UniValue::VOBJ);
    for (auto entry : psbtx.unknown) {
        unknowns.pushKV(HexStr(entry.first), HexStr(entry.second));
    }
    result.pushKV("unknown", std::move(unknowns));

    // inputs
    CAmount total_in = 0;
    bool have_all_utxos = true;
    UniValue inputs(UniValue::VARR);
    for (unsigned int i = 0; i < psbtx.inputs.size(); ++i) {
        const PSBTInput& input = psbtx.inputs[i];
        UniValue in(UniValue::VOBJ);
        // UTXOs
        bool have_a_utxo = false;
        CTxOut txout;
        if (!input.witness_utxo.IsNull()) {
            txout = input.witness_utxo;

            UniValue o(UniValue::VOBJ);
            ScriptToUniv(txout.scriptPubKey, /*out=*/o, /*include_hex=*/true, /*include_address=*/true);

            UniValue out(UniValue::VOBJ);
            out.pushKV("amount", ValueFromAmount(txout.nValue));
            out.pushKV("scriptPubKey", std::move(o));

            in.pushKV("witness_utxo", std::move(out));

            have_a_utxo = true;
        }
        if (input.non_witness_utxo) {
            txout = input.non_witness_utxo->vout[psbtx.tx->vin[i].prevout.n];

            UniValue non_wit(UniValue::VOBJ);
            TxToUniv(*input.non_witness_utxo, /*block_hash=*/uint256(), /*entry=*/non_wit, /*include_hex=*/false);
            in.pushKV("non_witness_utxo", std::move(non_wit));

            have_a_utxo = true;
        }
        if (have_a_utxo) {
            if (MoneyRange(txout.nValue) && MoneyRange(total_in + txout.nValue)) {
                total_in += txout.nValue;
            } else {
                // Hack to just not show fee later
                have_all_utxos = false;
            }
        } else {
            have_all_utxos = false;
        }

        // Partial sigs
        if (!input.partial_sigs.empty()) {
            UniValue partial_sigs(UniValue::VOBJ);
            for (const auto& sig : input.partial_sigs) {
                partial_sigs.pushKV(HexStr(sig.second.first), HexStr(sig.second.second));
            }
            in.pushKV("partial_signatures", std::move(partial_sigs));
        }

        // Sighash
        if (input.sighash_type != std::nullopt) {
            in.pushKV("sighash", SighashToStr((unsigned char)*input.sighash_type));
        }

        // Redeem script and witness script
        if (!input.redeem_script.empty()) {
            UniValue r(UniValue::VOBJ);
            ScriptToUniv(input.redeem_script, /*out=*/r);
            in.pushKV("redeem_script", std::move(r));
        }
        if (!input.witness_script.empty()) {
            UniValue r(UniValue::VOBJ);
            ScriptToUniv(input.witness_script, /*out=*/r);
            in.pushKV("witness_script", std::move(r));
        }

        // keypaths
        if (!input.hd_keypaths.empty()) {
            UniValue keypaths(UniValue::VARR);
            for (auto entry : input.hd_keypaths) {
                UniValue keypath(UniValue::VOBJ);
                keypath.pushKV("pubkey", HexStr(entry.first));

                keypath.pushKV("master_fingerprint", strprintf("%08x", ReadBE32(entry.second.fingerprint)));
                keypath.pushKV("path", WriteHDKeypath(entry.second.path));
                keypaths.push_back(std::move(keypath));
            }
            in.pushKV("bip32_derivs", std::move(keypaths));
        }

        // Final scriptSig and scriptwitness
        if (!input.final_script_sig.empty()) {
            UniValue scriptsig(UniValue::VOBJ);
            scriptsig.pushKV("asm", ScriptToAsmStr(input.final_script_sig, true));
            scriptsig.pushKV("hex", HexStr(input.final_script_sig));
            in.pushKV("final_scriptSig", std::move(scriptsig));
        }
        if (!input.final_script_witness.IsNull()) {
            UniValue txinwitness(UniValue::VARR);
            for (const auto& item : input.final_script_witness.stack) {
                txinwitness.push_back(HexStr(item));
            }
            in.pushKV("final_scriptwitness", std::move(txinwitness));
        }

        // Ripemd160 hash preimages
        if (!input.ripemd160_preimages.empty()) {
            UniValue ripemd160_preimages(UniValue::VOBJ);
            for (const auto& [hash, preimage] : input.ripemd160_preimages) {
                ripemd160_preimages.pushKV(HexStr(hash), HexStr(preimage));
            }
            in.pushKV("ripemd160_preimages", std::move(ripemd160_preimages));
        }

        // Sha256 hash preimages
        if (!input.sha256_preimages.empty()) {
            UniValue sha256_preimages(UniValue::VOBJ);
            for (const auto& [hash, preimage] : input.sha256_preimages) {
                sha256_preimages.pushKV(HexStr(hash), HexStr(preimage));
            }
            in.pushKV("sha256_preimages", std::move(sha256_preimages));
        }

        // Hash160 hash preimages
        if (!input.hash160_preimages.empty()) {
            UniValue hash160_preimages(UniValue::VOBJ);
            for (const auto& [hash, preimage] : input.hash160_preimages) {
                hash160_preimages.pushKV(HexStr(hash), HexStr(preimage));
            }
            in.pushKV("hash160_preimages", std::move(hash160_preimages));
        }

        // Hash256 hash preimages
        if (!input.hash256_preimages.empty()) {
            UniValue hash256_preimages(UniValue::VOBJ);
            for (const auto& [hash, preimage] : input.hash256_preimages) {
                hash256_preimages.pushKV(HexStr(hash), HexStr(preimage));
            }
            in.pushKV("hash256_preimages", std::move(hash256_preimages));
        }

        // Taproot key path signature
        if (!input.m_tap_key_sig.empty()) {
            in.pushKV("taproot_key_path_sig", HexStr(input.m_tap_key_sig));
        }

        // Taproot script path signatures
        if (!input.m_tap_script_sigs.empty()) {
            UniValue script_sigs(UniValue::VARR);
            for (const auto& [pubkey_leaf, sig] : input.m_tap_script_sigs) {
                const auto& [xonly, leaf_hash] = pubkey_leaf;
                UniValue sigobj(UniValue::VOBJ);
                sigobj.pushKV("pubkey", HexStr(xonly));
                sigobj.pushKV("leaf_hash", HexStr(leaf_hash));
                sigobj.pushKV("sig", HexStr(sig));
                script_sigs.push_back(std::move(sigobj));
            }
            in.pushKV("taproot_script_path_sigs", std::move(script_sigs));
        }

        // Taproot leaf scripts
        if (!input.m_tap_scripts.empty()) {
            UniValue tap_scripts(UniValue::VARR);
            for (const auto& [leaf, control_blocks] : input.m_tap_scripts) {
                const auto& [script, leaf_ver] = leaf;
                UniValue script_info(UniValue::VOBJ);
                script_info.pushKV("script", HexStr(script));
                script_info.pushKV("leaf_ver", leaf_ver);
                UniValue control_blocks_univ(UniValue::VARR);
                for (const auto& control_block : control_blocks) {
                    control_blocks_univ.push_back(HexStr(control_block));
                }
                script_info.pushKV("control_blocks", std::move(control_blocks_univ));
                tap_scripts.push_back(std::move(script_info));
            }
            in.pushKV("taproot_scripts", std::move(tap_scripts));
        }

        // Taproot bip32 keypaths
        if (!input.m_tap_bip32_paths.empty()) {
            UniValue keypaths(UniValue::VARR);
            for (const auto& [xonly, leaf_origin] : input.m_tap_bip32_paths) {
                const auto& [leaf_hashes, origin] = leaf_origin;
                UniValue path_obj(UniValue::VOBJ);
                path_obj.pushKV("pubkey", HexStr(xonly));
                path_obj.pushKV("master_fingerprint", strprintf("%08x", ReadBE32(origin.fingerprint)));
                path_obj.pushKV("path", WriteHDKeypath(origin.path));
                UniValue leaf_hashes_arr(UniValue::VARR);
                for (const auto& leaf_hash : leaf_hashes) {
                    leaf_hashes_arr.push_back(HexStr(leaf_hash));
                }
                path_obj.pushKV("leaf_hashes", std::move(leaf_hashes_arr));
                keypaths.push_back(std::move(path_obj));
            }
            in.pushKV("taproot_bip32_derivs", std::move(keypaths));
        }

        // Taproot internal key
        if (!input.m_tap_internal_key.IsNull()) {
            in.pushKV("taproot_internal_key", HexStr(input.m_tap_internal_key));
        }

        // Write taproot merkle root
        if (!input.m_tap_merkle_root.IsNull()) {
            in.pushKV("taproot_merkle_root", HexStr(input.m_tap_merkle_root));
        }

        // Proprietary
        if (!input.m_proprietary.empty()) {
            UniValue proprietary(UniValue::VARR);
            for (const auto& entry : input.m_proprietary) {
                UniValue this_prop(UniValue::VOBJ);
                this_prop.pushKV("identifier", HexStr(entry.identifier));
                this_prop.pushKV("subtype", entry.subtype);
                this_prop.pushKV("key", HexStr(entry.key));
                this_prop.pushKV("value", HexStr(entry.value));
                proprietary.push_back(std::move(this_prop));
            }
            in.pushKV("proprietary", std::move(proprietary));
        }

        // Unknown data
        if (input.unknown.size() > 0) {
            UniValue unknowns(UniValue::VOBJ);
            for (auto entry : input.unknown) {
                unknowns.pushKV(HexStr(entry.first), HexStr(entry.second));
            }
            in.pushKV("unknown", std::move(unknowns));
        }

        inputs.push_back(std::move(in));
    }
    result.pushKV("inputs", std::move(inputs));

    // outputs
    CAmount output_value = 0;
    UniValue outputs(UniValue::VARR);
    for (unsigned int i = 0; i < psbtx.outputs.size(); ++i) {
        const PSBTOutput& output = psbtx.outputs[i];
        UniValue out(UniValue::VOBJ);
        // Redeem script and witness script
        if (!output.redeem_script.empty()) {
            UniValue r(UniValue::VOBJ);
            ScriptToUniv(output.redeem_script, /*out=*/r);
            out.pushKV("redeem_script", std::move(r));
        }
        if (!output.witness_script.empty()) {
            UniValue r(UniValue::VOBJ);
            ScriptToUniv(output.witness_script, /*out=*/r);
            out.pushKV("witness_script", std::move(r));
        }

        // keypaths
        if (!output.hd_keypaths.empty()) {
            UniValue keypaths(UniValue::VARR);
            for (auto entry : output.hd_keypaths) {
                UniValue keypath(UniValue::VOBJ);
                keypath.pushKV("pubkey", HexStr(entry.first));
                keypath.pushKV("master_fingerprint", strprintf("%08x", ReadBE32(entry.second.fingerprint)));
                keypath.pushKV("path", WriteHDKeypath(entry.second.path));
                keypaths.push_back(std::move(keypath));
            }
            out.pushKV("bip32_derivs", std::move(keypaths));
        }

        // Taproot internal key
        if (!output.m_tap_internal_key.IsNull()) {
            out.pushKV("taproot_internal_key", HexStr(output.m_tap_internal_key));
        }

        // Taproot tree
        if (!output.m_tap_tree.empty()) {
            UniValue tree(UniValue::VARR);
            for (const auto& [depth, leaf_ver, script] : output.m_tap_tree) {
                UniValue elem(UniValue::VOBJ);
                elem.pushKV("depth", (int)depth);
                elem.pushKV("leaf_ver", (int)leaf_ver);
                elem.pushKV("script", HexStr(script));
                tree.push_back(std::move(elem));
            }
            out.pushKV("taproot_tree", std::move(tree));
        }

        // Taproot bip32 keypaths
        if (!output.m_tap_bip32_paths.empty()) {
            UniValue keypaths(UniValue::VARR);
            for (const auto& [xonly, leaf_origin] : output.m_tap_bip32_paths) {
                const auto& [leaf_hashes, origin] = leaf_origin;
                UniValue path_obj(UniValue::VOBJ);
                path_obj.pushKV("pubkey", HexStr(xonly));
                path_obj.pushKV("master_fingerprint", strprintf("%08x", ReadBE32(origin.fingerprint)));
                path_obj.pushKV("path", WriteHDKeypath(origin.path));
                UniValue leaf_hashes_arr(UniValue::VARR);
                for (const auto& leaf_hash : leaf_hashes) {
                    leaf_hashes_arr.push_back(HexStr(leaf_hash));
                }
                path_obj.pushKV("leaf_hashes", std::move(leaf_hashes_arr));
                keypaths.push_back(std::move(path_obj));
            }
            out.pushKV("taproot_bip32_derivs", std::move(keypaths));
        }

        // Proprietary
        if (!output.m_proprietary.empty()) {
            UniValue proprietary(UniValue::VARR);
            for (const auto& entry : output.m_proprietary) {
                UniValue this_prop(UniValue::VOBJ);
                this_prop.pushKV("identifier", HexStr(entry.identifier));
                this_prop.pushKV("subtype", entry.subtype);
                this_prop.pushKV("key", HexStr(entry.key));
                this_prop.pushKV("value", HexStr(entry.value));
                proprietary.push_back(std::move(this_prop));
            }
            out.pushKV("proprietary", std::move(proprietary));
        }

        // Unknown data
        if (output.unknown.size() > 0) {
            UniValue unknowns(UniValue::VOBJ);
            for (auto entry : output.unknown) {
                unknowns.pushKV(HexStr(entry.first), HexStr(entry.second));
            }
            out.pushKV("unknown", std::move(unknowns));
        }

        outputs.push_back(std::move(out));

        // Fee calculation
        if (MoneyRange(psbtx.tx->vout[i].nValue) && MoneyRange(output_value + psbtx.tx->vout[i].nValue)) {
            output_value += psbtx.tx->vout[i].nValue;
        } else {
            // Hack to just not show fee later
            have_all_utxos = false;
        }
    }
    result.pushKV("outputs", std::move(outputs));
    if (have_all_utxos) {
        result.pushKV("fee", ValueFromAmount(total_in - output_value));
    }

    return result;
},
    };
}